

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O3

void __thiscall Test_aistr_length_Test::TestBody(Test_aistr_length_Test *this)

{
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  AssertHelper local_30;
  Message local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    ai::length((char *)0x0,10);
  }
  testing::Message::Message(&local_28);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x22,
             "Expected: ai::length(nullptr, 10) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_38,&local_28);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) != 0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((long *)CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) + 8))();
    }
  }
  pcVar3 = "";
  local_38.data_ = (AssertHelperData *)ai::length("",10);
  local_30.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_28,"ai::length(\"\", 10)","0",(unsigned_long *)&local_38,
             (int *)&local_30);
  iVar1 = local_28.ss_.ptr_._0_1_;
  if (local_28.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_38.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_38.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar1 != (internal)0x0) {
    local_38.data_ = (AssertHelperData *)ai::length("1234",10);
    local_30.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&local_28,"ai::length(\"1234\", 10)","4",(unsigned_long *)&local_38,
               (int *)&local_30);
    iVar1 = local_28.ss_.ptr_._0_1_;
    if (local_28.ss_.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x24,pcVar3);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (local_38.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_38.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_38.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar1 != (internal)0x0) {
      local_38.data_ = (AssertHelperData *)ai::length("123456789",9);
      local_30.data_._0_4_ = 9;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&local_28,"ai::length(\"123456789\", 9)","9",(unsigned_long *)&local_38
                 ,(int *)&local_30);
      iVar1 = local_28.ss_.ptr_._0_1_;
      if (local_28.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_20.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x25,pcVar3);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if (local_38.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_38.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_38.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (iVar1 != (internal)0x0) {
        local_38.data_ = (AssertHelperData *)ai::length("1234567890",10);
        local_30.data_._0_4_ = 10;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&local_28,"ai::length(\"1234567890\", 10)","10",
                   (unsigned_long *)&local_38,(int *)&local_30);
        iVar1 = local_28.ss_.ptr_._0_1_;
        if (local_28.ss_.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_38);
          if (local_20.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x26,pcVar3);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if (local_38.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_38.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_38.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (iVar1 != (internal)0x0) {
          local_38.data_ = (AssertHelperData *)ai::length("12345678901",10);
          local_30.data_._0_4_ = 10;
          testing::internal::CmpHelperEQ<unsigned_long,int>
                    ((internal *)&local_28,"ai::length(\"12345678901\", 10)","10",
                     (unsigned_long *)&local_38,(int *)&local_30);
          if (local_28.ss_.ptr_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_38);
            if (local_20.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_30,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                       ,0x27,pcVar3);
            testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
            testing::internal::AssertHelper::~AssertHelper(&local_30);
            if (local_38.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_38.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_38.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, length) {
    EXPECT_THROW(ai::length(nullptr, 10), std::invalid_argument);
    ASSERT_EQ(ai::length("", 10), 0);
    ASSERT_EQ(ai::length("1234", 10), 4);
    ASSERT_EQ(ai::length("123456789", 9), 9);
    ASSERT_EQ(ai::length("1234567890", 10), 10);
    ASSERT_EQ(ai::length("12345678901", 10), 10);
}